

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

Error __thiscall
llvm::object::ObjectFile::printSymbolName(ObjectFile *this,raw_ostream *OS,DataRefImpl Symb)

{
  StringRef Str;
  storage_type *psVar1;
  Expected<llvm::StringRef> local_38 [8];
  Expected<llvm::StringRef> Name;
  byte local_28;
  
  (*OS->_vptr_raw_ostream[8])(local_38);
  if ((local_28 & 1) == 0) {
    psVar1 = Expected<llvm::StringRef>::getStorage(local_38);
    Str.Data = psVar1->Data;
    Str.Length = psVar1->Length;
    raw_ostream::operator<<((raw_ostream *)Symb,Str);
    (this->super_SymbolicFile).super_Binary._vptr_Binary = (_func_int **)0x1;
  }
  else {
    Expected<llvm::StringRef>::takeError((Expected<llvm::StringRef> *)this);
  }
  Expected<llvm::StringRef>::~Expected(local_38);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error ObjectFile::printSymbolName(raw_ostream &OS, DataRefImpl Symb) const {
  Expected<StringRef> Name = getSymbolName(Symb);
  if (!Name)
    return Name.takeError();
  OS << *Name;
  return Error::success();
}